

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O2

void Gia_ManFanoutStart(Gia_Man_t *p)

{
  int *__s;
  Gia_Obj_t *pFanout;
  ulong uVar1;
  uint uVar2;
  int v;
  int iVar3;
  int iVar4;
  
  if (p->pFanData != (int *)0x0) {
    __assert_fail("p->pFanData == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaFanout.c"
                  ,0x47,"void Gia_ManFanoutStart(Gia_Man_t *)");
  }
  iVar3 = p->nObjs;
  iVar4 = 0x1000;
  if (0x7ff < iVar3) {
    iVar4 = iVar3 * 2;
  }
  p->nFansAlloc = iVar4;
  __s = (int *)malloc((long)(iVar4 * 5) << 2);
  p->pFanData = __s;
  v = 0;
  memset(__s,0,(long)iVar4 * 0x14);
  while( true ) {
    if (iVar3 <= v) {
      return;
    }
    pFanout = Gia_ManObj(p,v);
    if (pFanout == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pFanout;
    if ((Gia_Obj_t *)(ulong)((uint)(uVar1 >> 0x1d) & 1) !=
        pFanout + -(ulong)((uint)uVar1 & 0x1fffffff)) {
      Gia_ObjAddFanout(p,pFanout + -(ulong)((uint)uVar1 & 0x1fffffff),pFanout);
      uVar1 = *(ulong *)pFanout;
    }
    uVar2 = (uint)(uVar1 >> 0x20);
    if ((Gia_Obj_t *)(ulong)(uVar2 >> 0x1d & 1) != pFanout + -(ulong)(uVar2 & 0x1fffffff)) {
      Gia_ObjAddFanout(p,pFanout + -(ulong)(uVar2 & 0x1fffffff),pFanout);
    }
    v = v + 1;
    iVar3 = p->nObjs;
  }
  return;
}

Assistant:

void Gia_ManFanoutStart( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    // allocate fanout datastructure
    assert( p->pFanData == NULL );
    p->nFansAlloc = 2 * Gia_ManObjNum(p);
    if ( p->nFansAlloc < (1<<12) )
        p->nFansAlloc = (1<<12);
    p->pFanData = ABC_ALLOC( int, 5 * p->nFansAlloc );
    memset( p->pFanData, 0, sizeof(int) * 5 * p->nFansAlloc );
    // add fanouts for all objects
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjChild0(pObj) )
            Gia_ObjAddFanout( p, Gia_ObjFanin0(pObj), pObj );
        if ( Gia_ObjChild1(pObj) )
            Gia_ObjAddFanout( p, Gia_ObjFanin1(pObj), pObj );
    }
}